

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O2

void __thiscall PixelToaster::UnixDisplay::pumpEvents(UnixDisplay *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  int i;
  ulong uVar5;
  XEvent event;
  UnixDisplay *pUVar4;
  
  do {
    iVar1 = XCheckWindowEvent(this->display_,this->window_,0xffffffffffffffff,&event);
    if (iVar1 == 0) {
      iVar1 = XCheckTypedEvent(this->display_,0x21,&event);
      if (iVar1 == 0) {
        for (uVar5 = 0; uVar5 != 0x100; uVar5 = uVar5 + 1) {
          if (((&keyIsReleased_)[uVar5] == '\x01') && (((&keyIsPressed_)[uVar5] & 1) != 0)) {
            iVar1 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                      [0xe])(this);
            if (CONCAT44(extraout_var,iVar1) != 0) {
              iVar1 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                        [0xe])(this);
              iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                        [0x10])(this);
              pUVar4 = this;
              if (CONCAT44(extraout_var_01,iVar2) != 0) {
                uVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                          [0x10])(this,this);
                pUVar4 = (UnixDisplay *)(ulong)uVar3;
              }
              (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
                        ((long *)CONCAT44(extraout_var_00,iVar1),pUVar4,uVar5 & 0xffffffff);
            }
            (&keyIsPressed_)[uVar5] = 0;
            (&keyIsReleased_)[uVar5] = 0;
          }
          else if (((&keyIsPressed_)[uVar5] & 1) != 0) {
            iVar1 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                      [0xe])(this);
            if (CONCAT44(extraout_var_02,iVar1) != 0) {
              iVar1 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                        [0xe])(this);
              iVar2 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                        [0x10])(this);
              pUVar4 = this;
              if (CONCAT44(extraout_var_04,iVar2) != 0) {
                uVar3 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface
                          [0x10])(this,this);
                pUVar4 = (UnixDisplay *)(ulong)uVar3;
              }
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x20))
                        ((long *)CONCAT44(extraout_var_03,iVar1),pUVar4,uVar5 & 0xffffffff);
            }
          }
        }
        return;
      }
    }
    handleEvent(this,&event);
  } while( true );
}

Assistant:

void pumpEvents()
    {
        ::XEvent event;
        while (true)
        {
            if (::XCheckWindowEvent(display_, window_, -1, &event))
            {
                handleEvent(event);
            }
            else if (::XCheckTypedEvent(display_, ClientMessage, &event))
            {
                handleEvent(event);
            }
            else
            {
                break;
            }
        }

        // send key press and up events

        for (int i = 0; i < keyMapSize_; ++i)
        {
            if (keyIsReleased_[i] && keyIsPressed_[i])
            {
                if (listener())
                    listener()->onKeyUp(wrapper() ? *wrapper() : *(DisplayInterface*)this, static_cast<Key::Code>(i));
                keyIsPressed_[i]  = false;
                keyIsReleased_[i] = false;
            }
            else if (keyIsPressed_[i])
            {
                if (listener())
                    listener()->onKeyPressed(wrapper() ? *wrapper() : *(DisplayInterface*)this, static_cast<Key::Code>(i));
            }
        }
    }